

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::anon_unknown_14::parseFlag(int argc,char **argv,char *pattern)

{
  bool bVar1;
  String *in_RDX;
  char **in_RSI;
  undefined4 in_EDI;
  String *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  
  String::String((String *)0x11695d);
  bVar1 = parseOption((int)in_RDX,in_RSI,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98,(String *)0x116979);
  String::~String(in_RDX);
  return bVar1;
}

Assistant:

bool parseFlag(int argc, const char* const* argv, const char* pattern) {
        return parseOption(argc, argv, pattern);
    }